

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ModuleData * __thiscall ExpressionContext::GetSourceOwner(ExpressionContext *this,Lexeme *lexeme)

{
  ModuleData *pMVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->code <= lexeme->pos) && (lexeme->pos <= this->codeEnd)) {
    return (ModuleData *)0x0;
  }
  uVar2 = (ulong)(this->uniqueDependencies).count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pMVar1 = (this->uniqueDependencies).data[uVar3];
      if ((pMVar1->lexStream <= lexeme) && (lexeme <= pMVar1->lexStream + pMVar1->lexStreamSize)) {
        return pMVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  __assert_fail("!\"failed to find source owner\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x808,"ModuleData *ExpressionContext::GetSourceOwner(Lexeme *)");
}

Assistant:

ModuleData* ExpressionContext::GetSourceOwner(Lexeme *lexeme)
{
	// Fast check for current module
	if(lexeme->pos >= code && lexeme->pos <= codeEnd)
		return NULL;

	for(unsigned i = 0; i < uniqueDependencies.size(); i++)
	{
		ModuleData *moduleData = uniqueDependencies[i];

		if(lexeme >= moduleData->lexStream && lexeme <= moduleData->lexStream + moduleData->lexStreamSize)
			return moduleData;
	}

	// Should not get here
	assert(!"failed to find source owner");
	return NULL;
}